

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall
leveldb::DBImpl::GetApproximateSizes(DBImpl *this,Range *range,int n,uint64_t *sizes)

{
  Version *this_00;
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  long lVar5;
  InternalKey k1;
  InternalKey k2;
  ParsedInternalKey local_a8;
  pthread_mutex_t *local_88;
  long local_80;
  uint64_t *local_78;
  string local_70;
  string local_50;
  
  local_88 = (pthread_mutex_t *)&this->mutex_;
  local_78 = sizes;
  iVar1 = pthread_mutex_lock(local_88);
  if (iVar1 == 0) {
    this_00 = this->versions_->current_;
    Version::Ref(this_00);
    if (0 < n) {
      local_80 = (ulong)(uint)n << 3;
      lVar5 = 0;
      do {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_a8.user_key.data_ = *(char **)(range + lVar5 * 4);
        local_a8.user_key.size_ = *(size_t *)(range + lVar5 * 4 + 8);
        local_a8.sequence = 0xffffffffffffff;
        local_a8.type = kTypeValue;
        AppendInternalKey(&local_70,&local_a8);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_a8.user_key.data_ = *(char **)(range + lVar5 * 4 + 0x10);
        local_a8.user_key.size_ = *(size_t *)(range + lVar5 * 4 + 0x10 + 8);
        local_a8.sequence = 0xffffffffffffff;
        local_a8.type = kTypeValue;
        AppendInternalKey(&local_50,&local_a8);
        uVar2 = VersionSet::ApproximateOffsetOf(this->versions_,this_00,(InternalKey *)&local_70);
        uVar3 = VersionSet::ApproximateOffsetOf(this->versions_,this_00,(InternalKey *)&local_50);
        lVar4 = uVar3 - uVar2;
        if (uVar3 < uVar2) {
          lVar4 = 0;
        }
        *(long *)((long)local_78 + lVar5) = lVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        lVar5 = lVar5 + 8;
      } while (local_80 != lVar5);
    }
    Version::Unref(this_00);
    pthread_mutex_unlock(local_88);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void DBImpl::GetApproximateSizes(const Range* range, int n, uint64_t* sizes) {
  // TODO(opt): better implementation
  MutexLock l(&mutex_);
  Version* v = versions_->current();
  v->Ref();

  for (int i = 0; i < n; i++) {
    // Convert user_key into a corresponding internal key.
    InternalKey k1(range[i].start, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey k2(range[i].limit, kMaxSequenceNumber, kValueTypeForSeek);
    uint64_t start = versions_->ApproximateOffsetOf(v, k1);
    uint64_t limit = versions_->ApproximateOffsetOf(v, k2);
    sizes[i] = (limit >= start ? limit - start : 0);
  }

  v->Unref();
}